

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA3Application.cpp
# Opt level: O1

void PA3Application::resize(GLFWwindow *window,int framebufferWidth,int framebufferHeight)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  pvVar1 = glfwGetWindowUserPointer(window);
  fVar2 = (float)framebufferHeight / (float)framebufferWidth;
  if (fVar2 <= 1.0) {
    fVar3 = 1.0;
    fVar4 = 1.0 / fVar2 - -1.0 / fVar2;
    fVar5 = 2.0 / fVar4;
    fVar4 = -(1.0 / fVar2 + -1.0 / fVar2) / fVar4;
    fVar2 = -0.0;
  }
  else {
    fVar3 = 2.0 / (fVar2 + fVar2);
    fVar2 = -(fVar2 - fVar2) / (fVar2 + fVar2);
    fVar4 = -0.0;
    fVar5 = 1.0;
  }
  *(float *)((long)pvVar1 + 0x30) = fVar5;
  *(undefined8 *)((long)pvVar1 + 0x34) = 0;
  *(undefined8 *)((long)pvVar1 + 0x3c) = 0;
  *(float *)((long)pvVar1 + 0x44) = fVar3;
  *(undefined8 *)((long)pvVar1 + 0x48) = 0;
  *(undefined8 *)((long)pvVar1 + 0x50) = 0;
  *(undefined8 *)((long)pvVar1 + 0x58) = 0x3f800000;
  *(float *)((long)pvVar1 + 0x60) = fVar4;
  *(float *)((long)pvVar1 + 100) = fVar2;
  *(undefined8 *)((long)pvVar1 + 0x68) = 0x3f80000000000000;
  glViewport(0,0,framebufferWidth,framebufferHeight);
  return;
}

Assistant:

void PA3Application::resize(GLFWwindow * window, int framebufferWidth, int framebufferHeight)
{
  PA3Application & app = *static_cast<PA3Application *>(glfwGetWindowUserPointer(window));
  float aspect = framebufferHeight / float(framebufferWidth);
  if (aspect > 1) {
    app.m_proj = glm::ortho(-1.f, 1.f, -aspect, aspect);
  } else {
    app.m_proj = glm::ortho(-1 / aspect, 1 / aspect, -1.f, 1.f);
  }
  glViewport(0, 0, framebufferWidth, framebufferHeight);
}